

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::BoxCoordinatesMode::Clear(BoxCoordinatesMode *this)

{
  this->boxmode_ = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BoxCoordinatesMode::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.BoxCoordinatesMode)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  boxmode_ = 0;
  _internal_metadata_.Clear<std::string>();
}